

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O2

base_learner * autolink_setup(options_i *options,vw *all)

{
  int iVar1;
  base_learner *l;
  single_learner *base;
  learner<autolink,_example> *plVar2;
  uint32_t *puVar3;
  free_ptr<autolink> data;
  option_group_definition new_options;
  allocator local_202;
  allocator local_201;
  free_ptr<autolink> local_200;
  string local_1f0 [32];
  string local_1d0;
  string local_1b0;
  option_group_definition local_190;
  undefined1 local_158 [112];
  bool local_e8;
  typed_option<unsigned_int> local_b8;
  
  scoped_calloc_or_throw<autolink>();
  std::__cxx11::string::string((string *)&local_1b0,"Autolink",(allocator *)local_158);
  VW::config::option_group_definition::option_group_definition(&local_190,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"autolink",&local_201);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_158,&local_1d0,
             &(local_200._M_t.super___uniq_ptr_impl<autolink,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_autolink_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_autolink_*,_false>._M_head_impl)->d);
  local_e8 = true;
  std::__cxx11::string::string(local_1f0,"create link function with polynomial d",&local_202);
  std::__cxx11::string::_M_assign((string *)(local_158 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_b8,(typed_option<unsigned_int> *)local_158);
  VW::config::option_group_definition::add<unsigned_int>(&local_190,&local_b8);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_b8);
  std::__cxx11::string::~string(local_1f0);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_158);
  std::__cxx11::string::~string((string *)&local_1d0);
  (**options->_vptr_options_i)(options,&local_190);
  std::__cxx11::string::string((string *)local_158,"autolink",(allocator *)local_1f0);
  iVar1 = (*options->_vptr_options_i[1])(options,local_158);
  std::__cxx11::string::~string((string *)local_158);
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<autolink,_example> *)0x0;
  }
  else {
    puVar3 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar3 = &(all->weights).sparse_weights._stride_shift;
    }
    (local_200._M_t.super___uniq_ptr_impl<autolink,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_autolink_*,_void_(*)(void_*)>.super__Head_base<0UL,_autolink_*,_false>.
    _M_head_impl)->stride_shift = *puVar3;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::init_learner<autolink,example,LEARNER::learner<char,example>>
                       (&local_200,base,predict_or_learn<true>,predict_or_learn<false>);
  }
  VW::config::option_group_definition::~option_group_definition(&local_190);
  std::unique_ptr<autolink,_void_(*)(void_*)>::~unique_ptr(&local_200);
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* autolink_setup(options_i& options, vw& all)
{
  free_ptr<autolink> data = scoped_calloc_or_throw<autolink>();
  option_group_definition new_options("Autolink");
  new_options.add(make_option("autolink", data->d).keep().help("create link function with polynomial d"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("autolink"))
    return nullptr;

  data->stride_shift = all.weights.stride_shift();

  LEARNER::learner<autolink, example>& ret =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);

  return make_base(ret);
}